

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LoadIniSettingsFromMemory(char *ini_data,size_t ini_size)

{
  char *__dest;
  ImGuiContext *this;
  char *pcVar1;
  ImGuiSettingsHandler *pIVar2;
  char *pcVar3;
  char *pcVar4;
  size_t in_RSI;
  char *in_RDI;
  bool bVar5;
  int handler_n_1;
  char *name_start;
  char *type_end;
  char *type_start;
  char *name_end;
  char *line;
  char *line_end;
  ImGuiSettingsHandler *entry_handler;
  void *entry_data;
  int handler_n;
  char *buf_end;
  char *buf;
  ImGuiContext *g;
  int in_stack_ffffffffffffff4c;
  ImGuiContext *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  _func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *p_Var6;
  char *in_stack_ffffffffffffff60;
  int local_74;
  char *local_50;
  char *local_48;
  ImGuiSettingsHandler *local_40;
  char *local_38;
  int local_2c;
  size_t local_10;
  
  this = GImGui;
  if ((GImGui->Initialized & 1U) != 0) {
    local_10 = in_RSI;
    if (in_RSI == 0) {
      local_10 = strlen(in_RDI);
    }
    ImVector<char>::resize((ImVector<char> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    __dest = (this->SettingsIniData).Buf.Data;
    pcVar1 = __dest + local_10;
    memcpy(__dest,in_RDI,local_10);
    *pcVar1 = '\0';
    for (local_2c = 0; local_2c < (this->SettingsHandlers).Size; local_2c = local_2c + 1) {
      pIVar2 = ImVector<ImGuiSettingsHandler>::operator[]
                         ((ImVector<ImGuiSettingsHandler> *)in_stack_ffffffffffffff50,
                          in_stack_ffffffffffffff4c);
      if (pIVar2->ReadInitFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
        pIVar2 = ImVector<ImGuiSettingsHandler>::operator[]
                           ((ImVector<ImGuiSettingsHandler> *)in_stack_ffffffffffffff50,
                            in_stack_ffffffffffffff4c);
        p_Var6 = pIVar2->ReadInitFn;
        pIVar2 = ImVector<ImGuiSettingsHandler>::operator[]
                           ((ImVector<ImGuiSettingsHandler> *)in_stack_ffffffffffffff50,
                            in_stack_ffffffffffffff4c);
        (*p_Var6)(this,pIVar2);
      }
    }
    local_38 = (char *)0x0;
    local_40 = (ImGuiSettingsHandler *)0x0;
    local_50 = __dest;
    while (local_50 < pcVar1) {
      while( true ) {
        bVar5 = true;
        if (*local_50 != '\n') {
          bVar5 = *local_50 == '\r';
        }
        if (!bVar5) break;
        local_50 = local_50 + 1;
      }
      local_48 = local_50;
      while( true ) {
        bVar5 = false;
        if ((local_48 < pcVar1) && (bVar5 = false, *local_48 != '\n')) {
          bVar5 = *local_48 != '\r';
        }
        if (!bVar5) break;
        local_48 = local_48 + 1;
      }
      *local_48 = '\0';
      if (*local_50 != ';') {
        if (((*local_50 == '[') && (local_50 < local_48)) && (local_48[-1] == ']')) {
          local_48[-1] = '\0';
          pcVar3 = ImStrchrRange(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                 (char)((ulong)in_stack_ffffffffffffff50 >> 0x38));
          if ((pcVar3 != (char *)0x0) &&
             (pcVar4 = ImStrchrRange(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                     (char)((ulong)in_stack_ffffffffffffff50 >> 0x38)),
             pcVar4 != (char *)0x0)) {
            *pcVar3 = '\0';
            local_40 = FindSettingsHandler(in_stack_ffffffffffffff58);
            if (local_40 == (ImGuiSettingsHandler *)0x0) {
              in_stack_ffffffffffffff60 = (char *)0x0;
              local_38 = in_stack_ffffffffffffff60;
            }
            else {
              in_stack_ffffffffffffff60 = (char *)(*local_40->ReadOpenFn)(this,local_40,pcVar4 + 1);
              local_38 = in_stack_ffffffffffffff60;
            }
          }
        }
        else if ((local_40 != (ImGuiSettingsHandler *)0x0) && (local_38 != (char *)0x0)) {
          (*local_40->ReadLineFn)(this,local_40,local_38,local_50);
        }
      }
      local_50 = local_48 + 1;
    }
    this->SettingsLoaded = true;
    memcpy(__dest,in_RDI,local_10);
    for (local_74 = 0; local_74 < (this->SettingsHandlers).Size; local_74 = local_74 + 1) {
      pIVar2 = ImVector<ImGuiSettingsHandler>::operator[]
                         ((ImVector<ImGuiSettingsHandler> *)in_stack_ffffffffffffff50,
                          in_stack_ffffffffffffff4c);
      if (pIVar2->ApplyAllFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
        pIVar2 = ImVector<ImGuiSettingsHandler>::operator[]
                           ((ImVector<ImGuiSettingsHandler> *)in_stack_ffffffffffffff50,
                            in_stack_ffffffffffffff4c);
        p_Var6 = pIVar2->ApplyAllFn;
        in_stack_ffffffffffffff50 = this;
        pIVar2 = ImVector<ImGuiSettingsHandler>::operator[]
                           ((ImVector<ImGuiSettingsHandler> *)this,in_stack_ffffffffffffff4c);
        (*p_Var6)(in_stack_ffffffffffffff50,pIVar2);
      }
    }
    return;
  }
  __assert_fail("g.Initialized",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                ,0x2633,"void ImGui::LoadIniSettingsFromMemory(const char *, size_t)");
}

Assistant:

void ImGui::LoadIniSettingsFromMemory(const char* ini_data, size_t ini_size)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    //IM_ASSERT(!g.WithinFrameScope && "Cannot be called between NewFrame() and EndFrame()");
    //IM_ASSERT(g.SettingsLoaded == false && g.FrameCount == 0);

    // For user convenience, we allow passing a non zero-terminated string (hence the ini_size parameter).
    // For our convenience and to make the code simpler, we'll also write zero-terminators within the buffer. So let's create a writable copy..
    if (ini_size == 0)
        ini_size = strlen(ini_data);
    g.SettingsIniData.Buf.resize((int)ini_size + 1);
    char* const buf = g.SettingsIniData.Buf.Data;
    char* const buf_end = buf + ini_size;
    memcpy(buf, ini_data, ini_size);
    buf_end[0] = 0;

    // Call pre-read handlers
    // Some types will clear their data (e.g. dock information) some types will allow merge/override (window)
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].ReadInitFn)
            g.SettingsHandlers[handler_n].ReadInitFn(&g, &g.SettingsHandlers[handler_n]);

    void* entry_data = NULL;
    ImGuiSettingsHandler* entry_handler = NULL;

    char* line_end = NULL;
    for (char* line = buf; line < buf_end; line = line_end + 1)
    {
        // Skip new lines markers, then find end of the line
        while (*line == '\n' || *line == '\r')
            line++;
        line_end = line;
        while (line_end < buf_end && *line_end != '\n' && *line_end != '\r')
            line_end++;
        line_end[0] = 0;
        if (line[0] == ';')
            continue;
        if (line[0] == '[' && line_end > line && line_end[-1] == ']')
        {
            // Parse "[Type][Name]". Note that 'Name' can itself contains [] characters, which is acceptable with the current format and parsing code.
            line_end[-1] = 0;
            const char* name_end = line_end - 1;
            const char* type_start = line + 1;
            char* type_end = (char*)(void*)ImStrchrRange(type_start, name_end, ']');
            const char* name_start = type_end ? ImStrchrRange(type_end + 1, name_end, '[') : NULL;
            if (!type_end || !name_start)
                continue;
            *type_end = 0; // Overwrite first ']'
            name_start++;  // Skip second '['
            entry_handler = FindSettingsHandler(type_start);
            entry_data = entry_handler ? entry_handler->ReadOpenFn(&g, entry_handler, name_start) : NULL;
        }
        else if (entry_handler != NULL && entry_data != NULL)
        {
            // Let type handler parse the line
            entry_handler->ReadLineFn(&g, entry_handler, entry_data, line);
        }
    }
    g.SettingsLoaded = true;

    // [DEBUG] Restore untouched copy so it can be browsed in Metrics (not strictly necessary)
    memcpy(buf, ini_data, ini_size);

    // Call post-read handlers
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].ApplyAllFn)
            g.SettingsHandlers[handler_n].ApplyAllFn(&g, &g.SettingsHandlers[handler_n]);
}